

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCreateTarget(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots,Vec_Int_t *vValues)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  long *plVar5;
  Abc_Obj_t *p1;
  int iVar6;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    Abc_NtkCleanCopy(pNtk);
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    pcVar2 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar2;
    p = Abc_NtkDfsNodes(pNtk,(Abc_Obj_t **)vRoots->pArray,vRoots->nSize);
    for (iVar6 = 0; iVar6 < pNtk->vCis->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkCi(pNtk,iVar6);
      pAVar4 = Abc_NtkCreatePi(pNtk_00);
      (pAVar3->field_6).pCopy = pAVar4;
      pcVar2 = Abc_ObjName(pAVar3);
      Abc_ObjAssignName(pAVar4,pcVar2,(char *)0x0);
    }
    for (iVar6 = 0; iVar6 < p->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar6);
      pAVar4 = Abc_NodeStrash(pNtk_00,pAVar3,0);
      (pAVar3->field_6).pCopy = pAVar4;
    }
    Vec_PtrFree(p);
    pAVar3 = Abc_AigConst1(pNtk_00);
    for (iVar6 = 0; iVar6 < vRoots->nSize; iVar6 = iVar6 + 1) {
      plVar5 = (long *)Vec_PtrEntry(vRoots,iVar6);
      if (0xfffffffd < (*(uint *)((long)plVar5 + 0x14) & 0xf) - 5) {
        plVar5 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8);
      }
      pAVar4 = (Abc_Obj_t *)plVar5[8];
      iVar1 = Vec_IntEntry(vValues,iVar6);
      p1 = (Abc_Obj_t *)((ulong)pAVar4 ^ 1);
      if (iVar1 != 0) {
        p1 = pAVar4;
      }
      pAVar3 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,pAVar3,p1);
    }
    pAVar4 = Abc_NtkCreatePo(pNtk_00);
    Abc_ObjAddFanin(pAVar4,pAVar3);
    Abc_ObjAssignName(pAVar4,"miter",(char *)0x0);
    iVar6 = Abc_NtkCheck(pNtk_00);
    if (iVar6 == 0) {
      fwrite("Abc_NtkCreateTarget(): Network check has failed.\n",0x31,1,_stdout);
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                ,0x480,"Abc_Ntk_t *Abc_NtkCreateTarget(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateTarget( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots, Vec_Int_t * vValues )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFinal, * pOther, * pNodePo;
    int i;

    assert( Abc_NtkIsLogic(pNtk) );
    
    // start the network
    Abc_NtkCleanCopy( pNtk );
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);

    // collect the nodes in the TFI of the output
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)vRoots->pArray, vRoots->nSize );
    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
    }
    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = Abc_NodeStrash( pNtkNew, pObj, 0 );
    Vec_PtrFree( vNodes );

    // add the PO
    pFinal = Abc_AigConst1( pNtkNew );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
    {
        if ( Abc_ObjIsCo(pObj) )
            pOther = Abc_ObjFanin0(pObj)->pCopy;
        else
            pOther = pObj->pCopy;
        if ( Vec_IntEntry(vValues, i) == 0 )
            pOther = Abc_ObjNot(pOther);
        pFinal = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pFinal, pOther );
    }

    // add the PO corresponding to this output
    pNodePo = Abc_NtkCreatePo( pNtkNew );
    Abc_ObjAddFanin( pNodePo, pFinal );
    Abc_ObjAssignName( pNodePo, "miter", NULL );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateTarget(): Network check has failed.\n" );
    return pNtkNew;
}